

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O2

void SUNDlsMat_bandScale(sunrealtype c,sunrealtype **a,sunindextype n,sunindextype mu,
                        sunindextype ml,sunindextype smu)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  if (n < 1) {
    n = lVar2;
  }
  for (; lVar2 != n; lVar2 = lVar2 + 1) {
    psVar1 = a[lVar2];
    for (lVar3 = 0; lVar3 <= ml + mu; lVar3 = lVar3 + 1) {
      psVar1[smu + (lVar3 - mu)] = psVar1[smu + (lVar3 - mu)] * c;
    }
  }
  return;
}

Assistant:

void SUNDlsMat_bandScale(sunrealtype c, sunrealtype** a, sunindextype n,
                         sunindextype mu, sunindextype ml, sunindextype smu)
{
  sunindextype i, j, colSize;
  sunrealtype* col_j;

  colSize = mu + ml + 1;

  for (j = 0; j < n; j++)
  {
    col_j = a[j] + smu - mu;
    for (i = 0; i < colSize; i++) { col_j[i] *= c; }
  }
}